

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

int absl::lts_20240722::synchronization_internal::MutexDelay(int32_t c,int mode)

{
  uint in_EAX;
  int iVar1;
  ScopedEnable enable_rescheduling;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  anon_unknown_11::GetMutexGlobals();
  iVar1 = *(int *)(&DAT_001145c8 + (long)mode * 4);
  anon_unknown_11::GetMutexGlobals();
  if (c < iVar1) {
    iVar1 = c + 1;
  }
  else {
    uStack_18 = (ulong)(uint)uStack_18;
    if (iVar1 == c) {
      AbslInternalMutexYield_lts_20240722();
      iVar1 = c + 1;
    }
    else {
      iVar1 = 0;
      AbslInternalSleepFor_lts_20240722(_DAT_001145d0,_DAT_001145d8);
    }
    base_internal::SchedulingGuard::ScopedEnable::~ScopedEnable
              ((ScopedEnable *)((long)&uStack_18 + 4));
  }
  return iVar1;
}

Assistant:

int MutexDelay(int32_t c, int mode) {
  const int32_t limit = GetMutexGlobals().mutex_sleep_spins[mode];
  const absl::Duration sleep_time = GetMutexGlobals().mutex_sleep_time;
  if (c < limit) {
    // Spin.
    c++;
  } else {
    SchedulingGuard::ScopedEnable enable_rescheduling;
    ABSL_TSAN_MUTEX_PRE_DIVERT(nullptr, 0);
    if (c == limit) {
      // Yield once.
      ABSL_INTERNAL_C_SYMBOL(AbslInternalMutexYield)();
      c++;
    } else {
      // Then wait.
      absl::SleepFor(sleep_time);
      c = 0;
    }
    ABSL_TSAN_MUTEX_POST_DIVERT(nullptr, 0);
  }
  return c;
}